

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

ON_RenderContent * __thiscall
ON_RenderContentPrivate::FindPrevSibling(ON_RenderContentPrivate *this,ON_RenderContent *child)

{
  ON_RenderContent *local_28;
  ON_RenderContent *candidate;
  ON_RenderContent *child_local;
  ON_RenderContentPrivate *this_local;
  
  if (child != this->m_first_child) {
    for (local_28 = this->m_first_child; local_28 != (ON_RenderContent *)0x0;
        local_28 = local_28->_private->m_next_sibling) {
      if (child == local_28->_private->m_next_sibling) {
        return local_28;
      }
    }
  }
  return (ON_RenderContent *)0x0;
}

Assistant:

ON_RenderContent* ON_RenderContentPrivate::FindPrevSibling(ON_RenderContent* child) const
{
  if (child != m_first_child)
  {
    ON_RenderContent* candidate = m_first_child;
    while (nullptr != candidate)
    {
      if (child == candidate->_private->m_next_sibling)
        return candidate;

      candidate = candidate->_private->m_next_sibling;
    }
  }

  return nullptr;
}